

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

bool __thiscall
Imath_3_2::Matrix33<double>::equalWithAbsError(Matrix33<double> *this,Matrix33<double> *m,double e)

{
  double x1;
  bool bVar1;
  double *pdVar2;
  Matrix33<double> *in_RSI;
  Matrix33<double> *in_RDI;
  double in_XMM0_Qa;
  int j;
  int i;
  int local_28;
  int local_24;
  
  local_24 = 0;
  do {
    if (2 < local_24) {
      return true;
    }
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      pdVar2 = operator[](in_RDI,local_24);
      x1 = pdVar2[local_28];
      pdVar2 = operator[](in_RSI,local_24);
      bVar1 = equalWithAbsError<double>(x1,pdVar2[local_28],in_XMM0_Qa);
      if (!bVar1) {
        return false;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Matrix33<T>::equalWithAbsError (const Matrix33<T>& m, T e) const IMATH_NOEXCEPT
{
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            if (!IMATH_INTERNAL_NAMESPACE::equalWithAbsError (
                    (*this)[i][j], m[i][j], e))
                return false;

    return true;
}